

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  FunctionData *pFVar3;
  runtime_error *prVar4;
  string_view name;
  char *errmsg;
  string ss;
  sqlite3 *db;
  Template temp;
  server_t s;
  Environment env;
  stringstream buf;
  ifstream file;
  string local_990;
  char *local_970;
  _Any_data local_968;
  code *local_958;
  code *pcStack_950;
  _Any_data local_948;
  code *local_938;
  undefined8 uStack_930;
  _Any_data local_928;
  code *local_918;
  code *local_910;
  undefined8 *local_900;
  undefined8 local_8f8;
  code *local_8f0;
  undefined8 uStack_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  undefined8 local_8c0;
  long *local_8b8;
  undefined8 uStack_8b0;
  code *local_8a8;
  undefined8 uStack_8a0;
  Template local_890;
  server_t local_858;
  Environment local_570;
  stringstream local_3c0 [16];
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  streambuf local_228 [504];
  
  local_8c0 = 0;
  iVar2 = sqlite3_open("bbs.db",&local_8c0);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"can\'t open database");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_238,"schema.sql",_S_in);
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  local_970 = (char *)0x0;
  iVar2 = sqlite3_exec(local_8c0,local_8e0._M_dataplus._M_p,0,0);
  if (iVar2 == 0) {
    inja::Environment::Environment(&local_570);
    paVar1 = &local_858.compiled_tree.field_2;
    local_858.compiled_tree._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"./index.html","");
    inja::Environment::parse_template(&local_890,&local_570,&local_858.compiled_tree);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858.compiled_tree._M_dataplus._M_p != paVar1) {
      operator_delete(local_858.compiled_tree._M_dataplus._M_p,
                      local_858.compiled_tree.field_2._M_allocated_capacity + 1);
    }
    local_858.compiled_tree._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"escape","");
    local_968._M_unused._M_object = (void *)0x0;
    local_968._8_8_ = 0;
    pcStack_950 = std::
                  _Function_handler<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:25:33)>
                  ::_M_invoke;
    local_958 = std::
                _Function_handler<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:25:33)>
                ::_M_manager;
    name._M_str = local_858.compiled_tree._M_dataplus._M_p;
    name._M_len = local_858.compiled_tree._M_string_length;
    pFVar3 = inja::FunctionStorage::get_or_new(&local_570.m_callbacks,name,1);
    std::
    function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&)>
    ::operator=(&pFVar3->function,
                (function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&)>
                 *)&local_968);
    if (local_958 != (code *)0x0) {
      (*local_958)(&local_968,&local_968,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858.compiled_tree._M_dataplus._M_p != paVar1) {
      operator_delete(local_858.compiled_tree._M_dataplus._M_p,
                      local_858.compiled_tree.field_2._M_allocated_capacity + 1);
    }
    clask::server_t::server_t(&local_858);
    paVar1 = &local_990.field_2;
    local_990._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"/","");
    local_8a8 = (code *)0x0;
    uStack_8a0 = 0;
    local_8b8 = (long *)0x0;
    uStack_8b0 = 0;
    local_928._M_unused._M_object = operator_new(0x18);
    *(undefined8 **)local_928._M_unused._0_8_ = &local_8c0;
    *(Environment **)((long)local_928._M_unused._0_8_ + 8) = &local_570;
    *(Template **)((long)local_928._M_unused._0_8_ + 0x10) = &local_890;
    local_938 = (code *)0x0;
    uStack_930 = 0;
    local_948._M_unused._M_object = (void *)0x0;
    local_948._8_8_ = 0;
    local_958 = (code *)0x0;
    pcStack_950 = (code *)0x0;
    local_968._M_unused._M_object = (void *)0x0;
    local_968._8_8_ = 0;
    local_910 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:30:14)>
                ::_M_invoke;
    local_928._8_8_ = uStack_8b0;
    local_918 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:30:14)>
                ::_M_manager;
    local_8a8 = (code *)0x0;
    uStack_8a0 = 0;
    local_8b8 = (long *)local_928._M_unused._0_8_;
    clask::server_t::parse_tree(&local_858,&local_858.treeGET,&local_990,(func_t *)&local_968);
    if (local_918 != (code *)0x0) {
      (*local_918)(&local_928,&local_928,__destroy_functor);
    }
    if (local_938 != (code *)0x0) {
      (*local_938)(&local_948,&local_948,__destroy_functor);
    }
    if (local_958 != (code *)0x0) {
      (*local_958)(&local_968,&local_968,3);
    }
    if (local_8a8 != (code *)0x0) {
      (*local_8a8)(&local_8b8,&local_8b8,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_990._M_dataplus._M_p != paVar1) {
      operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
    }
    local_990._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"/post","");
    local_8f8 = 0;
    local_938 = (code *)0x0;
    uStack_930 = 0;
    local_948._M_unused._M_object = (void *)0x0;
    local_948._8_8_ = 0;
    local_958 = (code *)0x0;
    pcStack_950 = (code *)0x0;
    local_968._M_unused._M_object = (void *)0x0;
    local_968._8_8_ = 0;
    local_910 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:49:19)>
                ::_M_invoke;
    local_928._8_8_ = 0;
    local_918 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:49:19)>
                ::_M_manager;
    local_8f0 = (code *)0x0;
    uStack_8e8 = 0;
    local_928._M_unused._M_object = &local_8c0;
    local_900 = &local_8c0;
    clask::server_t::parse_tree(&local_858,&local_858.treePOST,&local_990,(func_t *)&local_968);
    if (local_918 != (code *)0x0) {
      (*local_918)(&local_928,&local_928,__destroy_functor);
    }
    if (local_938 != (code *)0x0) {
      (*local_938)(&local_948,&local_948,__destroy_functor);
    }
    if (local_958 != (code *)0x0) {
      (*local_958)(&local_968,&local_968,3);
    }
    if (local_8f0 != (code *)0x0) {
      (*local_8f0)(&local_900,&local_900,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_990._M_dataplus._M_p != paVar1) {
      operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
    }
    local_968._8_8_ = 0;
    local_958 = (code *)((ulong)local_958 & 0xffffffffffffff00);
    local_968._M_unused._M_object = &local_958;
    clask::server_t::_run(&local_858,(string *)&local_968,0x1f90);
    if ((code **)local_968._M_unused._0_8_ != &local_958) {
      operator_delete(local_968._M_unused._M_object,(ulong)(local_958 + 1));
    }
    clask::server_t::~server_t(&local_858);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890.content._M_dataplus._M_p != &local_890.content.field_2) {
      operator_delete(local_890.content._M_dataplus._M_p,
                      local_890.content.field_2._M_allocated_capacity + 1);
    }
    std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::~vector(&local_890.bytecodes);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
    ::~_Rb_tree(&local_570.m_included_templates._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
                 *)&local_570.m_callbacks);
    inja::LexerConfig::~LexerConfig(&local_570.m_lexer_config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.m_output_path._M_dataplus._M_p != &local_570.m_output_path.field_2) {
      operator_delete(local_570.m_output_path._M_dataplus._M_p,
                      local_570.m_output_path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.m_input_path._M_dataplus._M_p != &local_570.m_input_path.field_2) {
      operator_delete(local_570.m_input_path._M_dataplus._M_p,
                      local_570.m_input_path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
      operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
    std::ifstream::~ifstream(local_238);
    return 0;
  }
  std::__cxx11::string::operator=((string *)&local_8e0,local_970);
  sqlite3_free(local_970);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_858.compiled_tree,"can\'t execute schema.sql: ",&local_8e0);
  std::runtime_error::runtime_error(prVar4,(string *)&local_858);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
  sqlite3 *db = nullptr;
  int r = sqlite3_open("bbs.db", &db);
  if (SQLITE_OK != r) {
    throw std::runtime_error("can't open database");
  }
  std::ifstream file("schema.sql");
  std::stringstream buf;
  buf << file.rdbuf();
  std::string ss = buf.str();
  char* errmsg = nullptr;
  r = sqlite3_exec(db, ss.c_str(), nullptr, nullptr, &errmsg);
  if (SQLITE_OK != r) {
    ss = errmsg;
    sqlite3_free(errmsg);
    throw std::runtime_error("can't execute schema.sql: " + ss);
  }

  inja::Environment env;
  inja::Template temp = env.parse_template("./index.html");
  env.add_callback("escape", 1, [](inja::Arguments& args) {
    return clask::html_encode(args.at(0)->get<std::string>());
  });
  auto s = clask::server();

  s.GET("/", [&](clask::request& req) -> clask::response {
    nlohmann::json data;
    auto sql = "select id, text from bbs order by created";
    sqlite3_stmt *stmt = nullptr;
    sqlite3_prepare(db, sql, -1, &stmt, nullptr);
    int n = 0;
    data["posts"] = {};
    while (SQLITE_DONE != sqlite3_step(stmt)) {
      data["posts"][n]["id"] = (std::string) (char*) sqlite3_column_text(stmt, 0);
      data["posts"][n]["text"] = (std::string) (char*) sqlite3_column_text(stmt, 1);
      n++;
    }
    sqlite3_finalize(stmt);
    return clask::response {
      .code = 200,
      .content = env.render(temp, data),
    };
  });

  s.POST("/post", [&](clask::request& req) -> clask::response {
    auto params = clask::params(req.body);
    auto q = params["text"];
    if (q.empty()) {
      return clask::response {
        .code = 400,
        .content = "Bad Request",
      };
    }
    auto sql = "insert into bbs(text) values(?)";
    sqlite3_stmt *stmt = nullptr;
    sqlite3_prepare(db, sql, -1, &stmt, nullptr);
    sqlite3_bind_text(stmt, 1, q.c_str(), -1,
      (sqlite3_destructor_type) SQLITE_TRANSIENT);
    sqlite3_step(stmt);
    sqlite3_finalize(stmt);
    return clask::response {
      .code = 302,
      .headers = {
        { "Location", "/" },
      },
    };
  });

  s.run();
}